

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

char double_conversion::anon_unknown_0::ToLower(char ch)

{
  char cVar1;
  int iVar2;
  locale *plVar3;
  
  if ((anonymous_namespace)::ToLower(char)::cType == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType);
    if (iVar2 != 0) {
      plVar3 = (locale *)std::locale::classic();
      ToLower::cType = (ctype<char> *)std::use_facet<std::ctype<char>>(plVar3);
      __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
    }
  }
  cVar1 = (**(code **)(*(long *)ToLower::cType + 0x20))(ToLower::cType,(int)ch);
  return cVar1;
}

Assistant:

inline char ToLower(char ch) {
  static const std::ctype<char>& cType =
      std::use_facet<std::ctype<char> >(std::locale::classic());
  return cType.tolower(ch);
}